

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
btBox2dBox2dCollisionAlgorithm::btBox2dBox2dCollisionAlgorithm
          (btBox2dBox2dCollisionAlgorithm *this,btPersistentManifold *mf,
          btCollisionAlgorithmConstructionInfo *ci,btCollisionObjectWrapper *obj0Wrap,
          btCollisionObjectWrapper *obj1Wrap)

{
  btDispatcher *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  
  btActivatingCollisionAlgorithm::btActivatingCollisionAlgorithm
            (&this->super_btActivatingCollisionAlgorithm,ci,obj0Wrap,obj1Wrap);
  (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm._vptr_btCollisionAlgorithm
       = (_func_int **)&PTR__btBox2dBox2dCollisionAlgorithm_00223678;
  this->m_ownManifold = false;
  this->m_manifoldPtr = mf;
  if (mf == (btPersistentManifold *)0x0) {
    pbVar1 = (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.m_dispatcher;
    iVar2 = (*pbVar1->_vptr_btDispatcher[6])
                      (pbVar1,obj0Wrap->m_collisionObject,obj1Wrap->m_collisionObject);
    if ((char)iVar2 != '\0') {
      pbVar1 = (this->super_btActivatingCollisionAlgorithm).super_btCollisionAlgorithm.m_dispatcher;
      iVar2 = (*pbVar1->_vptr_btDispatcher[3])
                        (pbVar1,obj0Wrap->m_collisionObject,obj1Wrap->m_collisionObject);
      this->m_manifoldPtr = (btPersistentManifold *)CONCAT44(extraout_var,iVar2);
      this->m_ownManifold = true;
    }
  }
  return;
}

Assistant:

btBox2dBox2dCollisionAlgorithm::btBox2dBox2dCollisionAlgorithm(btPersistentManifold* mf,const btCollisionAlgorithmConstructionInfo& ci,const btCollisionObjectWrapper* obj0Wrap,const btCollisionObjectWrapper* obj1Wrap)
: btActivatingCollisionAlgorithm(ci,obj0Wrap,obj1Wrap),
m_ownManifold(false),
m_manifoldPtr(mf)
{
	if (!m_manifoldPtr && m_dispatcher->needsCollision(obj0Wrap->getCollisionObject(),obj1Wrap->getCollisionObject()))
	{
		m_manifoldPtr = m_dispatcher->getNewManifold(obj0Wrap->getCollisionObject(),obj1Wrap->getCollisionObject());
		m_ownManifold = true;
	}
}